

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_activate(command *cmd)

{
  player *p;
  _Bool _Var1;
  wchar_t wVar2;
  char *pcVar3;
  object *obj;
  
  p = player;
  pcVar3 = strstr(player->shape->name,"dragon");
  if ((pcVar3 == (char *)0x0) && (_Var1 = player_get_resume_normal_shape(p,cmd), !_Var1)) {
    cmd_set_repeat(L'\0');
    return;
  }
  wVar2 = cmd_get_item((command_conflict *)cmd,"item",&obj,"Activate which item? ",
                       "You have no items to activate.",obj_is_activatable,L'A');
  if (wVar2 == L'\0') {
    _Var1 = obj_can_activate(obj);
    if (_Var1) {
      _Var1 = use_aux(cmd,obj,USE_TIMEOUT,L'\x1f');
      if (_Var1) {
        return;
      }
    }
    else {
      msg("That item is still charging.");
    }
  }
  cmd_set_repeat(L'\0');
  return;
}

Assistant:

void do_cmd_activate(struct command *cmd)
{
	struct object *obj;

	if (!strstr(player->shape->name, "dragon") &&
		!player_get_resume_normal_shape(player, cmd)) {
		cmd_set_repeat(0);
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Activate which item? ",
			"You have no items to activate.",
			obj_is_activatable,
			USE_EQUIP | SHOW_FAIL) != CMD_OK) {
		cmd_set_repeat(0);
		return;
	}

	if (!obj_can_activate(obj)) {
		msg("That item is still charging.");
		cmd_set_repeat(0);
		return;
	}

	/* Disable autorepetition when successful. */
	if (!use_aux(cmd, obj, USE_TIMEOUT, MSG_ACT_ARTIFACT)) {
		cmd_set_repeat(0);
	}
}